

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O1

void LookToRead_CreateVTable(CLookToRead *p,int lookahead)

{
  code *pcVar1;
  
  pcVar1 = LookToRead_Look_Lookahead;
  if (lookahead == 0) {
    pcVar1 = LookToRead_Look_Exact;
  }
  (p->s).Look = pcVar1;
  (p->s).Skip = LookToRead_Skip;
  (p->s).Read = LookToRead_Read;
  (p->s).Seek = LookToRead_Seek;
  return;
}

Assistant:

void LookToRead_CreateVTable(CLookToRead *p, int lookahead)
{
  p->s.Look = lookahead ?
      LookToRead_Look_Lookahead :
      LookToRead_Look_Exact;
  p->s.Skip = LookToRead_Skip;
  p->s.Read = LookToRead_Read;
  p->s.Seek = LookToRead_Seek;
}